

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Jf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pNew;
  char *pcVar4;
  char *pcVar5;
  Jf_Par_t Pars;
  char Buffer [200];
  Jf_Par_t local_200;
  char local_f8 [200];
  
  Jf_ManSetDefaultPars(&local_200);
  Extra_UtilGetoptReset();
LAB_00283456:
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"KCDWaekmdcgvwh"), iVar3 = globalUtilOptind,
          0x60 < iVar1) {
      switch(iVar1) {
      case 0x61:
        local_200.fAreaOnly = local_200.fAreaOnly ^ 1;
        break;
      case 0x62:
      case 0x66:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6c:
        goto switchD_00283478_caseD_62;
      case 99:
        local_200.fGenCnf = local_200.fGenCnf ^ 1;
        break;
      case 100:
        local_200.fFuncDsd = local_200.fFuncDsd ^ 1;
        break;
      case 0x65:
        local_200.fOptEdge = local_200.fOptEdge ^ 1;
        break;
      case 0x67:
        local_200.fPureAig = local_200.fPureAig ^ 1;
        break;
      case 0x6b:
        local_200.fCoarsen = local_200.fCoarsen ^ 1;
        break;
      case 0x6d:
        local_200.fCutMin = local_200.fCutMin ^ 1;
        break;
      default:
        if (iVar1 == 0x76) {
          local_200.fVerbose = local_200.fVerbose ^ 1;
        }
        else {
          if (iVar1 != 0x77) goto switchD_00283478_caseD_62;
          local_200.fVeryVerbose = local_200.fVeryVerbose ^ 1;
        }
      }
    }
    if (iVar1 < 0x4b) break;
    if (iVar1 == 0x4b) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-K\" should be followed by a positive integer.\n";
        goto LAB_00283627;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      local_200.nLutSize = uVar2;
      if (((int)uVar2 < 2) || (local_200.nLutSizeMax < (int)uVar2)) {
        pcVar4 = "LUT size %d is not supported.\n";
LAB_00283645:
        globalUtilOptind = iVar3 + 1;
        Abc_Print(-1,pcVar4,(ulong)uVar2);
switchD_00283478_caseD_62:
        if (local_200.DelayTarget == -1) {
          builtin_strncpy(local_f8 + 8,"sible",6);
          builtin_strncpy(local_f8,"best pos",8);
        }
        else {
          sprintf(local_f8,"%d");
        }
        Abc_Print(-2,"usage: &jf [-KCDW num] [-akmdcgvwh]\n");
        Abc_Print(-2,"\t           performs technology mapping of the network\n");
        Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                  (ulong)(uint)local_200.nLutSizeMax,(ulong)(uint)local_200.nLutSize);
        Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                  (ulong)(uint)local_200.nCutNumMax,(ulong)(uint)local_200.nCutNum);
        Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
                  local_f8);
        Abc_Print(-2,
                  "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n",
                  (ulong)(uint)local_200.nVerbLimit);
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (local_200.fAreaOnly == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_200.fOptEdge == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-e       : toggles edge vs node minimization [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_200.fCoarsen == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_200.fCutMin == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-m       : toggles cut minimization [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_200.fFuncDsd == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-d       : toggles using DSD to represent cut functions [default = %s]\n",
                  pcVar4);
        pcVar4 = "yes";
        if (local_200.fGenCnf == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-c       : toggles mapping for CNF generation [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_200.fPureAig == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-g       : toggles generating AIG without mapping [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_200.fVerbose == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar4);
        if (local_200.fVeryVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar5);
        pcVar4 = "\t-h       : prints the command usage\n";
        iVar3 = -2;
LAB_00283863:
        Abc_Print(iVar3,pcVar4);
        return 1;
      }
    }
    else {
      if (iVar1 != 0x57) goto switchD_00283478_caseD_62;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-W\" should be followed by a positive integer.\n";
        goto LAB_00283627;
      }
      local_200.nVerbLimit = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if (local_200.nVerbLimit < 0) goto switchD_00283478_caseD_62;
    }
  }
  if (iVar1 == 0x43) {
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      local_200.nCutNum = uVar2;
      if (((int)uVar2 < 1) || (local_200.nCutNumMax < (int)uVar2)) {
        pcVar4 = "This number of cuts (%d) is not supported.\n";
        goto LAB_00283645;
      }
      goto LAB_00283456;
    }
    pcVar4 = "Command line switch \"-C\" should be followed by a positive integer.\n";
  }
  else {
    if (iVar1 != 0x44) {
      if (iVar1 != -1) goto switchD_00283478_caseD_62;
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        pcVar4 = "Empty GIA network.\n";
      }
      else if (pAbc->pGia->nBufs == 0) {
        if ((local_200.fGenCnf == 0U && local_200.fFuncDsd == 0U) || (local_200.nLutSize < 7)) {
          if ((local_200.fGenCnf == 0U && local_200.fFuncDsd == 0U) ||
             (iVar3 = Sdm_ManCanRead(), iVar3 != 0)) {
            pNew = Jf_ManPerformMapping(pAbc->pGia,&local_200);
            if (pNew != (Gia_Man_t *)0x0) {
              Abc_FrameUpdateGia(pAbc,pNew);
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9Jf(): Mapping into LUTs has failed.\n";
          }
          else {
            pcVar4 = "Abc_CommandAbc9Jf(): Cannot input DSD data from file.\n";
          }
        }
        else {
          pcVar4 = "Abc_CommandAbc9Jf(): DSD computation works for LUT6 or less.\n";
        }
      }
      else {
        pcVar4 = "Abc_CommandAbc9Jf(): This command does not work with barrier buffers.\n";
      }
      iVar3 = -1;
      goto LAB_00283863;
    }
    if (globalUtilOptind < argc) {
      local_200.DelayTarget = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar3 + 1;
      if (local_200.DelayTarget < 1) goto switchD_00283478_caseD_62;
      goto LAB_00283456;
    }
    pcVar4 = "Command line switch \"-D\" should be followed by a floating point number.\n";
  }
LAB_00283627:
  Abc_Print(-1,pcVar4);
  goto switchD_00283478_caseD_62;
}

Assistant:

int Abc_CommandAbc9Jf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Jf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCDWaekmdcgvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a floating point number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0.0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'e':
            pPars->fOptEdge ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'm':
            pPars->fCutMin ^= 1;
            break;
        case 'd':
            pPars->fFuncDsd ^= 1;
            break;
        case 'c':
            pPars->fGenCnf ^= 1;
            break;
        case 'g':
            pPars->fPureAig ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }

    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( Gia_ManBufNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): This command does not work with barrier buffers.\n" );
        return 1;
    }
    if ( (pPars->fFuncDsd || pPars->fGenCnf) && pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): DSD computation works for LUT6 or less.\n" );
        return 1;
    }

    if ( (pPars->fFuncDsd || pPars->fGenCnf) && !Sdm_ManCanRead() )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): Cannot input DSD data from file.\n" );
        return 1;
    }

    pNew = Jf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Jf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &jf [-KCDW num] [-akmdcgvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n", pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n", pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-W num   : min frequency when printing functions with \"-w\" [default = %d]\n", pPars->nVerbLimit );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n", pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-e       : toggles edge vs node minimization [default = %s]\n", pPars->fOptEdge? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n", pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-m       : toggles cut minimization [default = %s]\n", pPars->fCutMin? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggles using DSD to represent cut functions [default = %s]\n", pPars->fFuncDsd? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggles mapping for CNF generation [default = %s]\n", pPars->fGenCnf? "yes": "no" );
    Abc_Print( -2, "\t-g       : toggles generating AIG without mapping [default = %s]\n", pPars->fPureAig? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}